

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O3

void __thiscall
EmmyDebuggerManager::RemoveBreakpoint(EmmyDebuggerManager *this,string *file,int line)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  int iVar3;
  iterator __position;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointsMtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  __position._M_current =
       (this->breakpoints).
       super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->breakpoints).
        super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    peVar1 = ((__position._M_current)->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_00 = ((__position._M_current)->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (peVar1->line == line) {
      bVar2 = CompareIgnoreCase(&peVar1->file,file);
      if (bVar2) goto LAB_0014aae9;
      std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
      _M_erase(&this->breakpoints,__position);
      bVar2 = false;
    }
    else {
LAB_0014aae9:
      __position._M_current = __position._M_current + 1;
      bVar2 = true;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (bVar2);
  RefreshLineSet(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointsMtx);
  return;
}

Assistant:

void EmmyDebuggerManager::RemoveBreakpoint(const std::string& file, int line)
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	auto it = breakpoints.begin();
	while (it != breakpoints.end())
	{
		const auto bp = *it;
		if (bp->line == line && CompareIgnoreCase(bp->file, file) == 0)
		{
			breakpoints.erase(it);
			break;
		}
		++it;
	}
	RefreshLineSet();
}